

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O2

QSize __thiscall
QPixmapStyle::lineEditSizeFromContents
          (QPixmapStyle *this,QStyleOption *option,QSize *contentsSize,QWidget *param_3)

{
  Representation RVar1;
  Representation RVar2;
  int iVar3;
  QPixmapStyleDescriptor *this_00;
  QStyle *pQVar4;
  int iVar5;
  QSize QVar6;
  long in_FS_OFFSET;
  ControlDescriptor local_64;
  QPixmapStyleDescriptor local_60;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_64 = LE_Enabled;
  this_00 = QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::value
                      (&local_60,
                       (QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *)
                       (*(long *)&(this->super_QCommonStyle).super_QStyle.field_0x8 + 0xe8),
                       &local_64);
  pQVar4 = QStyle::proxy((QStyle *)this_00);
  iVar3 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,5,option,0);
  iVar5 = (contentsSize->wd).m_i + iVar3 * 2 + local_60.margins.m_left.m_i +
          local_60.margins.m_right.m_i;
  iVar3 = iVar3 * 2 + (contentsSize->ht).m_i + local_60.margins.m_top.m_i +
          local_60.margins.m_bottom.m_i;
  if (local_60.size.wd.m_i <= iVar5) {
    local_60.size.wd.m_i = iVar5;
  }
  RVar1.m_i = local_60.size.wd.m_i;
  if (local_60.tileRules.horizontal == RepeatTile) {
    RVar1.m_i = iVar5;
  }
  if (local_60.size.ht.m_i <= iVar3) {
    local_60.size.ht.m_i = iVar3;
  }
  RVar2.m_i = local_60.size.ht.m_i;
  if (local_60.tileRules.vertical == RepeatTile) {
    RVar2.m_i = iVar3;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    QVar6.ht.m_i = RVar2.m_i;
    QVar6.wd.m_i = RVar1.m_i;
    return QVar6;
  }
  __stack_chk_fail();
}

Assistant:

QSize QPixmapStyle::lineEditSizeFromContents(const QStyleOption *option,
                                             const QSize &contentsSize, const QWidget *) const
{
    Q_D(const QPixmapStyle);

    const QPixmapStyleDescriptor &desc = d->descriptors.value(LE_Enabled);
    const int border = 2 * proxy()->pixelMetric(PM_DefaultFrameWidth, option);

    int w = contentsSize.width() + border + desc.margins.left() + desc.margins.right();
    int h = contentsSize.height() + border + desc.margins.top() + desc.margins.bottom();

    return d->computeSize(desc, w, h);
}